

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_buffer.h
# Opt level: O0

void __thiscall absl::lts_20250127::CordBuffer::IncreaseLengthBy(CordBuffer *this,size_t n)

{
  bool bVar1;
  size_t sVar2;
  ulong uVar3;
  CordRepFlat *pCVar4;
  anon_class_1_0_00000001 local_19;
  size_t local_18;
  size_t n_local;
  CordBuffer *this_local;
  
  local_18 = n;
  n_local = (size_t)this;
  sVar2 = capacity(this);
  bVar1 = false;
  if (n <= sVar2) {
    sVar2 = length(this);
    uVar3 = sVar2 + local_18;
    sVar2 = capacity(this);
    bVar1 = uVar3 <= sVar2;
  }
  if (!bVar1) {
    IncreaseLengthBy::anon_class_1_0_00000001::operator()(&local_19);
  }
  bVar1 = Rep::is_short(&this->rep_);
  sVar2 = local_18;
  if (bVar1) {
    Rep::add_short_length(&this->rep_,local_18);
  }
  else {
    pCVar4 = Rep::rep(&this->rep_);
    (pCVar4->super_CordRep).length = sVar2 + (pCVar4->super_CordRep).length;
  }
  return;
}

Assistant:

inline void CordBuffer::IncreaseLengthBy(size_t n) {
  ABSL_HARDENING_ASSERT(n <= capacity() && length() + n <= capacity());
  if (rep_.is_short()) {
    rep_.add_short_length(n);
  } else {
    rep_.rep()->length += n;
  }
}